

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O3

void __thiscall StackVector<CMString>::Push(StackVector<CMString> *this,CMString In)

{
  pointer *ppCVar1;
  iterator __position;
  long lVar2;
  
  lVar2 = (long)this->CurSize;
  if (lVar2 < 0x40) {
    this->CurSize = this->CurSize + 1;
    this->Stack[lVar2].Hash = In.Hash;
    this->Stack[lVar2].Str = In.Str;
    this->Stack[lVar2].Len = In.Len;
  }
  else {
    __position._M_current =
         (this->Heap).super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Heap).super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CMString,std::allocator<CMString>>::_M_realloc_insert<CMString_const&>
                ((vector<CMString,std::allocator<CMString>> *)&this->Heap,__position,&In);
    }
    else {
      (__position._M_current)->Hash = In.Hash;
      (__position._M_current)->Str = In.Str;
      (__position._M_current)->Len = In.Len;
      ppCVar1 = &(this->Heap).super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    this->CurSize = this->CurSize + 1;
  }
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}